

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_roi_utils.c
# Opt level: O2

MPP_RET gen_vepu54x_roi(MppEncRoiImpl *ctx,Vepu541RoiCfg *dst)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  RK_S32 RVar5;
  int iVar6;
  MPP_RET MVar7;
  MPP_RET MVar8;
  uint uVar9;
  MPP_RET MVar10;
  int iVar11;
  Vepu541RoiCfg *pVVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  ulong uVar16;
  RoiRegionCfg *pRVar17;
  int iVar18;
  ulong uVar19;
  RK_S32 *pRVar20;
  uint uVar21;
  RK_S32 *pRVar22;
  uint uVar23;
  RK_U8 *pRVar24;
  uint uVar25;
  
  pRVar17 = ctx->regions;
  iVar6 = ctx->w + 0xf >> 4;
  iVar11 = ctx->h + 0xf >> 4;
  uVar23 = iVar6 + 3U & 0xfffffffc;
  uVar19 = 0;
  memset(ctx->cu_map,0,(ulong)ctx->cu_size);
  uVar25 = (iVar11 + 3U & 0x3ffffffc) * uVar23;
  uVar16 = (ulong)uVar25;
  if ((int)uVar25 < 1) {
    uVar16 = uVar19;
  }
  for (; uVar16 != uVar19; uVar19 = uVar19 + 1) {
    dst[uVar19] = (Vepu541RoiCfg)0x80;
  }
  if (ctx->h < 1 || ctx->w < 1) {
    MVar7 = _mpp_log_l(2,"enc_roi_utils","invalid size [%d:%d]\n","gen_vepu54x_roi");
    return MVar7;
  }
  MVar7 = ctx->count;
  MVar8 = MPP_OK;
  MVar10 = MPP_OK;
  if (MPP_OK < MVar7) {
    MVar10 = MVar7;
  }
  pRVar20 = &pRVar17->qp_mode;
  do {
    if (MVar10 == MVar8) {
      pRVar17 = ctx->regions;
      uVar25 = (int)(iVar6 + 3U) >> 2;
      MVar10 = MPP_OK;
      while( true ) {
        if (MVar7 <= MVar10) {
          return MVar10;
        }
        pRVar24 = ctx->cu_map;
        uVar1 = pRVar17->w;
        uVar2 = pRVar17->h;
        uVar9 = pRVar17->x + 0xf >> 4;
        uVar3 = pRVar17->y;
        if (((((iVar6 <= (int)uVar9) &&
              (_mpp_log_l(2,"enc_roi_utils","Assertion %s failed at %s:%d\n",0,
                          "pos_x_init >= 0 && pos_x_init < mb_w","gen_vepu54x_roi",0x120),
              (DAT_001193d3 & 0x10) != 0)) ||
             ((uVar21 = uVar1 + 0xf >> 4, iVar6 < (int)(uVar9 + uVar21) &&
              (_mpp_log_l(2,"enc_roi_utils","Assertion %s failed at %s:%d\n",0,
                          "pos_x_end >= 0 && pos_x_end <= mb_w","gen_vepu54x_roi",0x121),
              (DAT_001193d3 & 0x10) != 0)))) ||
            ((uVar14 = uVar3 + 0xf >> 4, iVar11 <= (int)uVar14 &&
             (_mpp_log_l(2,"enc_roi_utils","Assertion %s failed at %s:%d\n",0,
                         "pos_y_init >= 0 && pos_y_init < mb_h","gen_vepu54x_roi",0x122),
             (DAT_001193d3 & 0x10) != 0)))) ||
           ((uVar13 = uVar2 + 0xf >> 4, iVar11 < (int)(uVar14 + uVar13) &&
            (_mpp_log_l(2,"enc_roi_utils","Assertion %s failed at %s:%d\n",0,
                        "pos_y_end >= 0 && pos_y_end <= mb_h","gen_vepu54x_roi",0x123),
            (DAT_001193d3 & 0x10) != 0)))) break;
        RVar5 = pRVar17->force_intra;
        iVar18 = pRVar17->qp_mode;
        uVar4 = pRVar17->qp_val;
        iVar15 = uVar14 * uVar23 + uVar9;
        pVVar12 = dst + iVar15;
        pRVar24 = pRVar24 + iVar15;
        for (uVar9 = 0; uVar9 != uVar13; uVar9 = uVar9 + 1) {
          for (uVar16 = 0; uVar21 != uVar16; uVar16 = uVar16 + 1) {
            pVVar12[uVar16] =
                 (Vepu541RoiCfg)
                 ((short)(iVar18 << 0xf) + ((ushort)((uVar4 & 0x7f) << 8) | (ushort)RVar5 & 1) +
                 0x80);
            if (ctx->type == MPP_VIDEO_CodingAVC) {
              pRVar24[uVar16] = '\x01';
            }
          }
          pRVar24 = pRVar24 + (int)uVar23;
          pVVar12 = pVVar12 + (int)uVar23;
        }
        if (ctx->type == MPP_VIDEO_CodingHEVC) {
          uVar9 = pRVar17->w + 0x40 >> 6;
          uVar1 = pRVar17->x;
          if (uVar1 < 0x40) {
            uVar9 = uVar9 + 2;
            uVar21 = 0;
          }
          else if ((uVar1 & 0x3f) == 0) {
            uVar21 = (uint)(uVar1 >> 6);
          }
          else {
            uVar21 = uVar1 - 0x40 >> 6;
            uVar9 = uVar9 + 2;
          }
          uVar14 = pRVar17->h + 0x40 >> 6;
          uVar1 = pRVar17->y;
          if (uVar1 < 0x40) {
            uVar14 = uVar14 + 2;
            uVar13 = 0;
          }
          else if ((uVar1 & 0x3f) == 0) {
            uVar13 = (uint)(uVar1 >> 6);
          }
          else {
            uVar13 = uVar1 - 0x40 >> 6;
            uVar14 = uVar14 + 2;
          }
          pRVar24 = ctx->cu_map + (uVar25 * uVar13 + uVar21);
          for (uVar21 = 0; uVar21 != uVar14; uVar21 = uVar21 + 1) {
            for (uVar16 = 0; uVar9 != uVar16; uVar16 = uVar16 + 1) {
              pRVar24[uVar16] = '\x01';
            }
            pRVar24 = pRVar24 + uVar25;
          }
        }
        MVar10 = MVar10 + ~MPP_ERR_UNKNOW;
        pRVar17 = pRVar17 + 1;
        MVar7 = ctx->count;
      }
      abort();
    }
    if ((ctx->w < (int)((uint)*(ushort *)(pRVar20 + -2) + (uint)((RoiRegionCfg *)(pRVar20 + -3))->x)
        ) || (iVar18 = 0,
             ctx->h < (int)((uint)*(RK_U16 *)((long)pRVar20 + -6) +
                           (uint)*(RK_U16 *)((long)pRVar20 + -10)))) {
      iVar18 = -1;
    }
    iVar15 = -1;
    pRVar22 = pRVar20;
    if ((pRVar20[-1] < 2) && (iVar15 = iVar18, iVar18 = -1, 1 < *pRVar20)) {
LAB_0010a97e:
      if ((iVar18 != 0) || (0x33 < pRVar20[1])) {
LAB_0010ac8a:
        _mpp_log_l(2,"enc_roi_utils","region %d invalid param:\n","gen_vepu54x_roi",MVar8);
        _mpp_log_l(2,"enc_roi_utils","position [%d:%d:%d:%d] vs [%d:%d]\n","gen_vepu54x_roi",
                   ((RoiRegionCfg *)(pRVar20 + -3))->x,*(RK_U16 *)((long)pRVar20 + -10),
                   *(RK_U16 *)(pRVar20 + -2),*(RK_U16 *)((long)pRVar20 + -6),ctx->w,ctx->h);
        MVar7 = _mpp_log_l(2,"enc_roi_utils","force intra %d qp mode %d val %d\n","gen_vepu54x_roi",
                           pRVar20[-1],*pRVar22,pRVar20[1]);
        return MVar7;
      }
    }
    else {
      if (*pRVar20 != 0) {
        pRVar22 = &pRVar17->qp_mode;
        iVar18 = iVar15;
        goto LAB_0010a97e;
      }
      if ((iVar15 != 0) || (0x66 < pRVar20[1] + 0x33U)) goto LAB_0010ac8a;
    }
    MVar8 = MVar8 + ~MPP_ERR_UNKNOW;
    pRVar17 = pRVar17 + 1;
    pRVar20 = pRVar20 + 5;
  } while( true );
}

Assistant:

static MPP_RET gen_vepu54x_roi(MppEncRoiImpl *ctx, Vepu541RoiCfg *dst)
{
    RoiRegionCfg *region = ctx->regions;
    RK_S32 mb_w = MPP_ALIGN(ctx->w, 16) / 16;
    RK_S32 mb_h = MPP_ALIGN(ctx->h, 16) / 16;
    RK_S32 stride_h = MPP_ALIGN(mb_w, 4);
    RK_S32 stride_v = MPP_ALIGN(mb_h, 4);
    Vepu541RoiCfg cfg;
    MPP_RET ret = MPP_NOK;
    RK_S32 i;

    memset(ctx->cu_map, 0, ctx->cu_size);

    cfg.force_intra = 0;
    cfg.reserved    = 0;
    cfg.qp_area_idx = 0;
    cfg.qp_area_en  = 1;
    cfg.qp_adj      = 0;
    cfg.qp_adj_mode = 0;

    /* step 1. reset all the config */
    for (i = 0; i < stride_h * stride_v; i++)
        memcpy(dst + i, &cfg, sizeof(cfg));

    if (ctx->w <= 0 || ctx->h <= 0) {
        mpp_err_f("invalid size [%d:%d]\n", ctx->w, ctx->h);
        goto DONE;
    }

    /* check region config */
    ret = MPP_OK;
    for (i = 0; i < ctx->count; i++, region++) {
        if (region->x + region->w > ctx->w || region->y + region->h > ctx->h)
            ret = MPP_NOK;

        if (region->force_intra > 1 || region->qp_mode > 1)
            ret = MPP_NOK;

        if ((region->qp_mode && region->qp_val > 51) ||
            (!region->qp_mode && (region->qp_val > 51 || region->qp_val < -51)))
            ret = MPP_NOK;

        if (ret) {
            mpp_err_f("region %d invalid param:\n", i);
            mpp_err_f("position [%d:%d:%d:%d] vs [%d:%d]\n",
                      region->x, region->y, region->w, region->h, ctx->w, ctx->h);
            mpp_err_f("force intra %d qp mode %d val %d\n",
                      region->force_intra, region->qp_mode, region->qp_val);
            goto DONE;
        }
    }

    region = ctx->regions;
    /* step 2. setup region for top to bottom */
    for (i = 0; i < ctx->count; i++, region++) {
        Vepu541RoiCfg *p = dst;
        RK_U8 *map = ctx->cu_map;
        RK_S32 roi_width  = (region->w + 15) / 16;
        RK_S32 roi_height = (region->h + 15) / 16;
        RK_S32 pos_x_init = (region->x + 15) / 16;
        RK_S32 pos_y_init = (region->y + 15) / 16;
        RK_S32 pos_x_end  = pos_x_init + roi_width;
        RK_S32 pos_y_end  = pos_y_init + roi_height;
        RK_S32 x, y;

        mpp_assert(pos_x_init >= 0 && pos_x_init < mb_w);
        mpp_assert(pos_x_end  >= 0 && pos_x_end <= mb_w);
        mpp_assert(pos_y_init >= 0 && pos_y_init < mb_h);
        mpp_assert(pos_y_end  >= 0 && pos_y_end <= mb_h);

        cfg.force_intra = region->force_intra;
        cfg.reserved    = 0;
        cfg.qp_area_idx = 0;
        // NOTE: When roi is enabled the qp_area_en should be one.
        cfg.qp_area_en  = 1; // region->area_map_en;
        cfg.qp_adj      = region->qp_val;
        cfg.qp_adj_mode = region->qp_mode;

        p += pos_y_init * stride_h + pos_x_init;
        map += pos_y_init * stride_h + pos_x_init;
        for (y = 0; y < roi_height; y++) {
            for (x = 0; x < roi_width; x++) {
                memcpy(p + x, &cfg, sizeof(cfg));
                if (ctx->type == MPP_VIDEO_CodingAVC) {
                    *(map + x) = 1;
                }

            }
            p += stride_h;
            map += stride_h;
        }

        if (ctx->type == MPP_VIDEO_CodingHEVC) {
            map = ctx->cu_map;
            RK_U32 stride_cu64_h = stride_h * 16 / 64;

            roi_width  = (region->w + 64) / 64;
            roi_height = (region->h + 64) / 64;

            if (region->x < 64) {
                pos_x_init = 0;
                roi_width += 2;
            } else if (region->x % 64) {
                pos_x_init = (region->x - 64) / 64;
                roi_width += 2;
            } else
                pos_x_init = region->x / 64;

            if (region->y < 64) {
                pos_y_init = 0;
                roi_height += 2;
            } else if (region->y % 64) {
                pos_y_init = (region->y - 64) / 64;
                roi_height += 2;
            } else
                pos_y_init = region->y / 64;

            map += pos_y_init * stride_cu64_h + pos_x_init;
            for (y = 0; y < roi_height; y++) {
                for (x = 0; x < roi_width; x++) {
                    *(map + x) = 1;
                }
                map += stride_cu64_h;
            }
        }
    }

DONE:
    return ret;
}